

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_eval.cpp
# Opt level: O2

ON_3dPoint * __thiscall
ON_SubDFace::ControlNetCenterPoint(ON_3dPoint *__return_storage_ptr__,ON_SubDFace *this)

{
  double dVar1;
  ON_SubDVertex *this_00;
  unsigned_short fvi;
  ushort uVar2;
  ON_SubDEdgePtr *this_01;
  undefined1 auVar3 [16];
  undefined1 local_78 [16];
  double local_68;
  ON_3dPoint local_60;
  ON_3dVector local_48;
  
  if (this->m_edge_count < 3) {
    __return_storage_ptr__->z = ON_3dPoint::NanPoint.z;
    dVar1 = (double)CONCAT44(ON_3dPoint::NanPoint.y._4_4_,ON_3dPoint::NanPoint.y._0_4_);
    __return_storage_ptr__->x =
         (double)CONCAT44(ON_3dPoint::NanPoint.x._4_4_,ON_3dPoint::NanPoint.x._0_4_);
    __return_storage_ptr__->y = dVar1;
  }
  else {
    ON_3dPoint::ON_3dPoint((ON_3dPoint *)local_78,0.0,0.0,0.0);
    this_01 = this->m_edge4;
    for (uVar2 = 0; uVar2 < this->m_edge_count; uVar2 = uVar2 + 1) {
      if ((uVar2 == 4) && (this_01 = this->m_edgex, this_01 == (ON_SubDEdgePtr *)0x0)) {
LAB_00604a25:
        __return_storage_ptr__->z = ON_3dPoint::NanPoint.z;
        local_78._0_4_ = ON_3dPoint::NanPoint.x._0_4_;
        local_78._4_4_ = ON_3dPoint::NanPoint.x._4_4_;
        local_78._8_4_ = ON_3dPoint::NanPoint.y._0_4_;
        local_78._12_4_ = ON_3dPoint::NanPoint.y._4_4_;
        goto LAB_00604a80;
      }
      this_00 = ON_SubDEdgePtr::RelativeVertex(this_01,0);
      if (this_00 == (ON_SubDVertex *)0x0) goto LAB_00604a25;
      ON_SubDVertex::ControlNetPoint(&local_60,this_00);
      ON_3dVector::ON_3dVector(&local_48,&local_60);
      ON_3dPoint::operator+=((ON_3dPoint *)local_78,&local_48);
      this_01 = this_01 + 1;
    }
    dVar1 = (double)this->m_edge_count;
    auVar3._8_4_ = SUB84(dVar1,0);
    auVar3._0_8_ = dVar1;
    auVar3._12_4_ = (int)((ulong)dVar1 >> 0x20);
    auVar3 = divpd(local_78,auVar3);
    __return_storage_ptr__->z = local_68 / dVar1;
    local_78._0_4_ = auVar3._0_4_;
    local_78._4_4_ = auVar3._4_4_;
    local_78._8_4_ = auVar3._8_4_;
    local_78._12_4_ = auVar3._12_4_;
LAB_00604a80:
    *(undefined4 *)&__return_storage_ptr__->x = local_78._0_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->x + 4) = local_78._4_4_;
    *(undefined4 *)&__return_storage_ptr__->y = local_78._8_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->y + 4) = local_78._12_4_;
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_3dPoint ON_SubDFace::ControlNetCenterPoint() const
{
  if (m_edge_count < 3)
    return ON_3dPoint::NanPoint;
  ON_3dPoint center(0.0, 0.0, 0.0);
  const ON_SubDEdgePtr* eptr = m_edge4;
  for (unsigned short fvi = 0; fvi < m_edge_count; ++fvi, ++eptr)
  {
    if (4 == fvi)
    {
      eptr = m_edgex;
      if ( nullptr == eptr)
        return ON_3dPoint::NanPoint;
    }
    const ON_SubDVertex* v = eptr->RelativeVertex(0);
    if ( nullptr == v)
      return ON_3dPoint::NanPoint;
    center += v->ControlNetPoint();
  }
  const double c = (double)m_edge_count;
  center.x /= c;
  center.y /= c;
  center.z /= c;
  return center;
}